

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LazyJSONString.cpp
# Opt level: O1

bool __thiscall Js::LazyJSONString::HasComplexGap(LazyJSONString *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  
  uVar1 = (ulong)*(uint *)&(this->super_JavascriptString).field_0x1c;
  bVar4 = uVar1 != 0;
  if (bVar4) {
    uVar2 = 1;
    do {
      uVar3 = (ulong)(ushort)(this->gap).ptr[uVar2 - 1];
      if (0x20 < uVar3) {
        return bVar4;
      }
      if ((0x100000600U >> (uVar3 & 0x3f) & 1) == 0) {
        return bVar4;
      }
      bVar4 = uVar2 < uVar1;
      bVar5 = uVar2 != uVar1;
      uVar2 = uVar2 + 1;
    } while (bVar5);
  }
  return bVar4;
}

Assistant:

bool
LazyJSONString::HasComplexGap() const
{
    for (charcount_t i = 0; i < this->gapLength; ++i)
    {
        switch (this->gap[i])
        {
        // This is not exhaustive, just a useful subset of semantics preserving characters
        case _u(' '):
        case _u('\t'):
        case _u('\n'):
            continue;
        default:
            return true;
        }
    }
    return false;
}